

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.h
# Opt level: O2

void __thiscall HighsHessian::~HighsHessian(HighsHessian *this)

{
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->value_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->index_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->start_).super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

HighsHessian() { clear(); }